

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O0

void ImGui_ImplSDL2_NewFrame(SDL_Window *window)

{
  int iVar1;
  Uint64 UVar2;
  long lVar3;
  undefined8 in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Uint64 current_time;
  int display_h;
  int display_w;
  int h;
  int w;
  ImGuiIO *io;
  float local_54;
  ImVec2 local_30;
  ImVec2 local_28;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  local_10 = ImGui::GetIO();
  SDL_GetWindowSize(local_8,&local_14,&local_18);
  SDL_GL_GetDrawableSize(local_8,&local_1c,&local_20);
  ImVec2::ImVec2(&local_28,(float)local_14,(float)local_18);
  *(ImVec2 *)(local_10 + 8) = local_28;
  if ((0 < local_14) && (0 < local_18)) {
    ImVec2::ImVec2(&local_30,(float)local_1c / (float)local_14,(float)local_20 / (float)local_18);
    *(ImVec2 *)(local_10 + 0xb8) = local_30;
  }
  if (ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency == '\0') {
    iVar1 = __cxa_guard_acquire(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency);
    if (iVar1 != 0) {
      ImGui_ImplSDL2_NewFrame::frequency = SDL_GetPerformanceFrequency();
      __cxa_guard_release(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency);
    }
  }
  UVar2 = SDL_GetPerformanceCounter();
  if (g_Time == 0) {
    local_54 = 0.016666668;
  }
  else {
    lVar3 = UVar2 - g_Time;
    auVar4._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar4._0_8_ = lVar3;
    auVar4._12_4_ = 0x45300000;
    auVar5._8_4_ = (int)(ImGui_ImplSDL2_NewFrame::frequency >> 0x20);
    auVar5._0_8_ = ImGui_ImplSDL2_NewFrame::frequency;
    auVar5._12_4_ = 0x45300000;
    local_54 = (float)(((auVar4._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) /
                      ((auVar5._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)ImGui_ImplSDL2_NewFrame::frequency) -
                      4503599627370496.0)));
  }
  *(float *)(local_10 + 0x10) = local_54;
  g_Time = UVar2;
  ImGui_ImplSDL2_UpdateMousePosAndButtons();
  ImGui_ImplSDL2_UpdateMouseCursor();
  ImGui_ImplSDL2_UpdateGamepads();
  return;
}

Assistant:

void ImGui_ImplSDL2_NewFrame(SDL_Window* window)
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    SDL_GetWindowSize(window, &w, &h);
    SDL_GL_GetDrawableSize(window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / w, (float)display_h / h);

    // Setup time step (we don't use SDL_GetTicks() because it is using millisecond resolution)
    static Uint64 frequency = SDL_GetPerformanceFrequency();
    Uint64 current_time = SDL_GetPerformanceCounter();
    io.DeltaTime = g_Time > 0 ? (float)((double)(current_time - g_Time) / frequency) : (float)(1.0f / 60.0f);
    g_Time = current_time;

    ImGui_ImplSDL2_UpdateMousePosAndButtons();
    ImGui_ImplSDL2_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplSDL2_UpdateGamepads();
}